

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itread.c
# Opt level: O3

int decompress8(DUMBFILE *f,char *data,int len,int it215,int stereo)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  int in_EAX;
  int iVar29;
  uint uVar30;
  uint uVar31;
  int extraout_EAX;
  int extraout_EAX_00;
  long lVar32;
  uint uVar33;
  long lVar34;
  long lVar35;
  char cVar36;
  uint uVar37;
  long lVar38;
  byte bVar39;
  uint uVar40;
  uint uVar41;
  long lVar42;
  uint uVar43;
  char cVar44;
  uint uVar45;
  long lVar46;
  long lVar47;
  long lVar48;
  long lVar49;
  long lVar50;
  ulong uVar51;
  uint uVar52;
  long lVar53;
  long lVar54;
  long lVar55;
  char cVar56;
  bool bVar57;
  undefined1 auVar58 [16];
  undefined1 in_XMM1 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 in_XMM2 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  int iVar80;
  int iVar81;
  undefined1 auVar78 [16];
  int iVar82;
  undefined1 auVar79 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  int iVar96;
  int iVar100;
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  char *local_b8;
  long local_a8;
  long local_a0;
  long local_98;
  long local_80;
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  
  auVar28 = _DAT_0073c3e0;
  auVar27 = _DAT_0073c3d0;
  auVar26 = _DAT_0073c1a0;
  auVar25 = _DAT_0073c190;
  auVar24 = _DAT_0073c180;
  auVar23 = _DAT_0073b300;
  auVar22 = _DAT_0073b2f0;
  local_48 = (undefined1  [16])0x0;
  local_58 = (undefined1  [16])0x0;
  if (0 < len) {
    lVar32 = (long)(stereo + 1);
    lVar34 = (ulong)(uint)len - 1;
    auVar58._8_4_ = (int)lVar34;
    auVar58._0_8_ = lVar34;
    auVar58._12_4_ = (int)((ulong)lVar34 >> 0x20);
    local_a0 = lVar32 * 5;
    local_98 = lVar32 * 0xf;
    lVar47 = lVar32 * 0x10;
    lVar49 = lVar32 * 2;
    lVar50 = lVar32 * -2;
    lVar53 = lVar32 * 3;
    local_a8 = lVar32 * 0xd;
    lVar34 = lVar32 * 4;
    lVar42 = lVar32 * 0xc;
    lVar48 = lVar32 * 0xb;
    lVar35 = lVar32 * 10;
    lVar55 = lVar32 * 8;
    lVar46 = lVar32 * 7;
    lVar38 = lVar32 * 9;
    lVar54 = lVar32 * 6;
    local_80 = 0;
    uVar51 = 0;
    do {
      lVar50 = lVar47 + lVar50;
      auVar76._8_4_ = (int)uVar51;
      auVar76._0_8_ = uVar51;
      auVar76._12_4_ = (int)(uVar51 >> 0x20);
      auVar78 = auVar58 ^ auVar23;
      auVar83 = (auVar76 | auVar22) ^ auVar23;
      iVar29 = auVar78._0_4_;
      iVar96 = -(uint)(iVar29 < auVar83._0_4_);
      iVar80 = auVar78._4_4_;
      auVar85._4_4_ = -(uint)(iVar80 < auVar83._4_4_);
      iVar81 = auVar78._8_4_;
      iVar100 = -(uint)(iVar81 < auVar83._8_4_);
      iVar82 = auVar78._12_4_;
      auVar85._12_4_ = -(uint)(iVar82 < auVar83._12_4_);
      auVar59._4_4_ = iVar96;
      auVar59._0_4_ = iVar96;
      auVar59._8_4_ = iVar100;
      auVar59._12_4_ = iVar100;
      auVar59 = pshuflw(in_XMM1,auVar59,0xe8);
      auVar84._4_4_ = -(uint)(auVar83._4_4_ == iVar80);
      auVar84._12_4_ = -(uint)(auVar83._12_4_ == iVar82);
      auVar84._0_4_ = auVar84._4_4_;
      auVar84._8_4_ = auVar84._12_4_;
      auVar68 = pshuflw(in_XMM2,auVar84,0xe8);
      auVar85._0_4_ = auVar85._4_4_;
      auVar85._8_4_ = auVar85._12_4_;
      auVar83 = pshuflw(auVar59,auVar85,0xe8);
      auVar78._8_4_ = 0xffffffff;
      auVar78._0_8_ = 0xffffffffffffffff;
      auVar78._12_4_ = 0xffffffff;
      auVar78 = (auVar83 | auVar68 & auVar59) ^ auVar78;
      auVar78 = packssdw(auVar78,auVar78);
      if ((auVar78 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        data[local_80] = '\0';
      }
      auVar68._4_4_ = iVar96;
      auVar68._0_4_ = iVar96;
      auVar68._8_4_ = iVar100;
      auVar68._12_4_ = iVar100;
      auVar85 = auVar84 & auVar68 | auVar85;
      auVar78 = packssdw(auVar85,auVar85);
      auVar83._8_4_ = 0xffffffff;
      auVar83._0_8_ = 0xffffffffffffffff;
      auVar83._12_4_ = 0xffffffff;
      auVar78 = packssdw(auVar78 ^ auVar83,auVar78 ^ auVar83);
      auVar78 = packsswb(auVar78,auVar78);
      if ((auVar78._0_4_ >> 8 & 1) != 0) {
        data[lVar32] = '\0';
      }
      auVar78 = (auVar76 | auVar26) ^ auVar23;
      auVar69._0_4_ = -(uint)(iVar29 < auVar78._0_4_);
      auVar69._4_4_ = -(uint)(iVar80 < auVar78._4_4_);
      auVar69._8_4_ = -(uint)(iVar81 < auVar78._8_4_);
      auVar69._12_4_ = -(uint)(iVar82 < auVar78._12_4_);
      auVar86._4_4_ = auVar69._0_4_;
      auVar86._0_4_ = auVar69._0_4_;
      auVar86._8_4_ = auVar69._8_4_;
      auVar86._12_4_ = auVar69._8_4_;
      iVar96 = -(uint)(auVar78._4_4_ == iVar80);
      iVar100 = -(uint)(auVar78._12_4_ == iVar82);
      auVar10._4_4_ = iVar96;
      auVar10._0_4_ = iVar96;
      auVar10._8_4_ = iVar100;
      auVar10._12_4_ = iVar100;
      auVar97._4_4_ = auVar69._4_4_;
      auVar97._0_4_ = auVar69._4_4_;
      auVar97._8_4_ = auVar69._12_4_;
      auVar97._12_4_ = auVar69._12_4_;
      auVar78 = auVar10 & auVar86 | auVar97;
      auVar78 = packssdw(auVar78,auVar78);
      auVar1._8_4_ = 0xffffffff;
      auVar1._0_8_ = 0xffffffffffffffff;
      auVar1._12_4_ = 0xffffffff;
      auVar78 = packssdw(auVar78 ^ auVar1,auVar78 ^ auVar1);
      auVar78 = packsswb(auVar78,auVar78);
      if ((auVar78._0_4_ >> 0x10 & 1) != 0) {
        data[lVar49] = '\0';
      }
      auVar78 = pshufhw(auVar78,auVar86,0x84);
      auVar11._4_4_ = iVar96;
      auVar11._0_4_ = iVar96;
      auVar11._8_4_ = iVar100;
      auVar11._12_4_ = iVar100;
      auVar83 = pshufhw(auVar69,auVar11,0x84);
      auVar59 = pshufhw(auVar78,auVar97,0x84);
      auVar60._8_4_ = 0xffffffff;
      auVar60._0_8_ = 0xffffffffffffffff;
      auVar60._12_4_ = 0xffffffff;
      auVar60 = (auVar59 | auVar83 & auVar78) ^ auVar60;
      auVar78 = packssdw(auVar60,auVar60);
      auVar78 = packsswb(auVar78,auVar78);
      if ((auVar78._0_4_ >> 0x18 & 1) != 0) {
        data[lVar53] = '\0';
      }
      auVar78 = (auVar76 | auVar25) ^ auVar23;
      auVar70._0_4_ = -(uint)(iVar29 < auVar78._0_4_);
      auVar70._4_4_ = -(uint)(iVar80 < auVar78._4_4_);
      auVar70._8_4_ = -(uint)(iVar81 < auVar78._8_4_);
      auVar70._12_4_ = -(uint)(iVar82 < auVar78._12_4_);
      auVar12._4_4_ = auVar70._0_4_;
      auVar12._0_4_ = auVar70._0_4_;
      auVar12._8_4_ = auVar70._8_4_;
      auVar12._12_4_ = auVar70._8_4_;
      auVar83 = pshuflw(auVar97,auVar12,0xe8);
      auVar61._0_4_ = -(uint)(auVar78._0_4_ == iVar29);
      auVar61._4_4_ = -(uint)(auVar78._4_4_ == iVar80);
      auVar61._8_4_ = -(uint)(auVar78._8_4_ == iVar81);
      auVar61._12_4_ = -(uint)(auVar78._12_4_ == iVar82);
      auVar87._4_4_ = auVar61._4_4_;
      auVar87._0_4_ = auVar61._4_4_;
      auVar87._8_4_ = auVar61._12_4_;
      auVar87._12_4_ = auVar61._12_4_;
      auVar78 = pshuflw(auVar61,auVar87,0xe8);
      auVar88._4_4_ = auVar70._4_4_;
      auVar88._0_4_ = auVar70._4_4_;
      auVar88._8_4_ = auVar70._12_4_;
      auVar88._12_4_ = auVar70._12_4_;
      auVar59 = pshuflw(auVar70,auVar88,0xe8);
      auVar2._8_4_ = 0xffffffff;
      auVar2._0_8_ = 0xffffffffffffffff;
      auVar2._12_4_ = 0xffffffff;
      auVar78 = packssdw(auVar78 & auVar83,(auVar59 | auVar78 & auVar83) ^ auVar2);
      auVar78 = packsswb(auVar78,auVar78);
      if ((auVar78 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
        data[lVar34] = '\0';
      }
      auVar13._4_4_ = auVar70._0_4_;
      auVar13._0_4_ = auVar70._0_4_;
      auVar13._8_4_ = auVar70._8_4_;
      auVar13._12_4_ = auVar70._8_4_;
      auVar88 = auVar87 & auVar13 | auVar88;
      auVar59 = packssdw(auVar88,auVar88);
      auVar3._8_4_ = 0xffffffff;
      auVar3._0_8_ = 0xffffffffffffffff;
      auVar3._12_4_ = 0xffffffff;
      auVar78 = packssdw(auVar78,auVar59 ^ auVar3);
      auVar78 = packsswb(auVar78,auVar78);
      if ((auVar78._4_2_ >> 8 & 1) != 0) {
        data[local_a0] = '\0';
      }
      auVar78 = (auVar76 | auVar24) ^ auVar23;
      auVar71._0_4_ = -(uint)(iVar29 < auVar78._0_4_);
      auVar71._4_4_ = -(uint)(iVar80 < auVar78._4_4_);
      auVar71._8_4_ = -(uint)(iVar81 < auVar78._8_4_);
      auVar71._12_4_ = -(uint)(iVar82 < auVar78._12_4_);
      auVar89._4_4_ = auVar71._0_4_;
      auVar89._0_4_ = auVar71._0_4_;
      auVar89._8_4_ = auVar71._8_4_;
      auVar89._12_4_ = auVar71._8_4_;
      iVar96 = -(uint)(auVar78._4_4_ == iVar80);
      iVar100 = -(uint)(auVar78._12_4_ == iVar82);
      auVar14._4_4_ = iVar96;
      auVar14._0_4_ = iVar96;
      auVar14._8_4_ = iVar100;
      auVar14._12_4_ = iVar100;
      auVar98._4_4_ = auVar71._4_4_;
      auVar98._0_4_ = auVar71._4_4_;
      auVar98._8_4_ = auVar71._12_4_;
      auVar98._12_4_ = auVar71._12_4_;
      auVar78 = auVar14 & auVar89 | auVar98;
      auVar78 = packssdw(auVar78,auVar78);
      auVar4._8_4_ = 0xffffffff;
      auVar4._0_8_ = 0xffffffffffffffff;
      auVar4._12_4_ = 0xffffffff;
      auVar78 = packssdw(auVar78 ^ auVar4,auVar78 ^ auVar4);
      auVar78 = packsswb(auVar78,auVar78);
      if ((auVar78 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
        data[lVar54] = '\0';
      }
      auVar78 = pshufhw(auVar78,auVar89,0x84);
      auVar15._4_4_ = iVar96;
      auVar15._0_4_ = iVar96;
      auVar15._8_4_ = iVar100;
      auVar15._12_4_ = iVar100;
      auVar83 = pshufhw(auVar71,auVar15,0x84);
      auVar59 = pshufhw(auVar78,auVar98,0x84);
      auVar62._8_4_ = 0xffffffff;
      auVar62._0_8_ = 0xffffffffffffffff;
      auVar62._12_4_ = 0xffffffff;
      auVar62 = (auVar59 | auVar83 & auVar78) ^ auVar62;
      auVar78 = packssdw(auVar62,auVar62);
      auVar78 = packsswb(auVar78,auVar78);
      if ((auVar78._6_2_ >> 8 & 1) != 0) {
        data[lVar46] = '\0';
      }
      auVar78 = (auVar76 | auVar28) ^ auVar23;
      auVar72._0_4_ = -(uint)(iVar29 < auVar78._0_4_);
      auVar72._4_4_ = -(uint)(iVar80 < auVar78._4_4_);
      auVar72._8_4_ = -(uint)(iVar81 < auVar78._8_4_);
      auVar72._12_4_ = -(uint)(iVar82 < auVar78._12_4_);
      auVar16._4_4_ = auVar72._0_4_;
      auVar16._0_4_ = auVar72._0_4_;
      auVar16._8_4_ = auVar72._8_4_;
      auVar16._12_4_ = auVar72._8_4_;
      auVar83 = pshuflw(auVar98,auVar16,0xe8);
      auVar63._0_4_ = -(uint)(auVar78._0_4_ == iVar29);
      auVar63._4_4_ = -(uint)(auVar78._4_4_ == iVar80);
      auVar63._8_4_ = -(uint)(auVar78._8_4_ == iVar81);
      auVar63._12_4_ = -(uint)(auVar78._12_4_ == iVar82);
      auVar90._4_4_ = auVar63._4_4_;
      auVar90._0_4_ = auVar63._4_4_;
      auVar90._8_4_ = auVar63._12_4_;
      auVar90._12_4_ = auVar63._12_4_;
      auVar78 = pshuflw(auVar63,auVar90,0xe8);
      auVar91._4_4_ = auVar72._4_4_;
      auVar91._0_4_ = auVar72._4_4_;
      auVar91._8_4_ = auVar72._12_4_;
      auVar91._12_4_ = auVar72._12_4_;
      auVar59 = pshuflw(auVar72,auVar91,0xe8);
      auVar73._8_4_ = 0xffffffff;
      auVar73._0_8_ = 0xffffffffffffffff;
      auVar73._12_4_ = 0xffffffff;
      auVar73 = (auVar59 | auVar78 & auVar83) ^ auVar73;
      auVar59 = packssdw(auVar73,auVar73);
      auVar78 = packsswb(auVar78 & auVar83,auVar59);
      if ((auVar78 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        data[lVar55] = '\0';
      }
      auVar17._4_4_ = auVar72._0_4_;
      auVar17._0_4_ = auVar72._0_4_;
      auVar17._8_4_ = auVar72._8_4_;
      auVar17._12_4_ = auVar72._8_4_;
      auVar91 = auVar90 & auVar17 | auVar91;
      auVar59 = packssdw(auVar91,auVar91);
      auVar5._8_4_ = 0xffffffff;
      auVar5._0_8_ = 0xffffffffffffffff;
      auVar5._12_4_ = 0xffffffff;
      auVar59 = packssdw(auVar59 ^ auVar5,auVar59 ^ auVar5);
      auVar78 = packsswb(auVar78,auVar59);
      if ((auVar78._8_2_ >> 8 & 1) != 0) {
        data[lVar38] = '\0';
      }
      auVar78 = (auVar76 | auVar27) ^ auVar23;
      auVar74._0_4_ = -(uint)(iVar29 < auVar78._0_4_);
      auVar74._4_4_ = -(uint)(iVar80 < auVar78._4_4_);
      auVar74._8_4_ = -(uint)(iVar81 < auVar78._8_4_);
      auVar74._12_4_ = -(uint)(iVar82 < auVar78._12_4_);
      auVar92._4_4_ = auVar74._0_4_;
      auVar92._0_4_ = auVar74._0_4_;
      auVar92._8_4_ = auVar74._8_4_;
      auVar92._12_4_ = auVar74._8_4_;
      iVar96 = -(uint)(auVar78._4_4_ == iVar80);
      iVar100 = -(uint)(auVar78._12_4_ == iVar82);
      auVar18._4_4_ = iVar96;
      auVar18._0_4_ = iVar96;
      auVar18._8_4_ = iVar100;
      auVar18._12_4_ = iVar100;
      auVar99._4_4_ = auVar74._4_4_;
      auVar99._0_4_ = auVar74._4_4_;
      auVar99._8_4_ = auVar74._12_4_;
      auVar99._12_4_ = auVar74._12_4_;
      auVar78 = auVar18 & auVar92 | auVar99;
      auVar78 = packssdw(auVar78,auVar78);
      auVar6._8_4_ = 0xffffffff;
      auVar6._0_8_ = 0xffffffffffffffff;
      auVar6._12_4_ = 0xffffffff;
      auVar78 = packssdw(auVar78 ^ auVar6,auVar78 ^ auVar6);
      auVar78 = packsswb(auVar78,auVar78);
      if ((auVar78 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
        data[lVar35] = '\0';
      }
      auVar78 = pshufhw(auVar78,auVar92,0x84);
      auVar19._4_4_ = iVar96;
      auVar19._0_4_ = iVar96;
      auVar19._8_4_ = iVar100;
      auVar19._12_4_ = iVar100;
      auVar83 = pshufhw(auVar74,auVar19,0x84);
      auVar59 = pshufhw(auVar78,auVar99,0x84);
      auVar64._8_4_ = 0xffffffff;
      auVar64._0_8_ = 0xffffffffffffffff;
      auVar64._12_4_ = 0xffffffff;
      auVar64 = (auVar59 | auVar83 & auVar78) ^ auVar64;
      auVar78 = packssdw(auVar64,auVar64);
      auVar78 = packsswb(auVar78,auVar78);
      if ((auVar78._10_2_ >> 8 & 1) != 0) {
        data[lVar48] = '\0';
      }
      auVar78 = (auVar76 | _DAT_0073c3c0) ^ auVar23;
      auVar75._0_4_ = -(uint)(iVar29 < auVar78._0_4_);
      auVar75._4_4_ = -(uint)(iVar80 < auVar78._4_4_);
      auVar75._8_4_ = -(uint)(iVar81 < auVar78._8_4_);
      auVar75._12_4_ = -(uint)(iVar82 < auVar78._12_4_);
      auVar20._4_4_ = auVar75._0_4_;
      auVar20._0_4_ = auVar75._0_4_;
      auVar20._8_4_ = auVar75._8_4_;
      auVar20._12_4_ = auVar75._8_4_;
      auVar83 = pshuflw(auVar99,auVar20,0xe8);
      auVar65._0_4_ = -(uint)(auVar78._0_4_ == iVar29);
      auVar65._4_4_ = -(uint)(auVar78._4_4_ == iVar80);
      auVar65._8_4_ = -(uint)(auVar78._8_4_ == iVar81);
      auVar65._12_4_ = -(uint)(auVar78._12_4_ == iVar82);
      auVar93._4_4_ = auVar65._4_4_;
      auVar93._0_4_ = auVar65._4_4_;
      auVar93._8_4_ = auVar65._12_4_;
      auVar93._12_4_ = auVar65._12_4_;
      auVar78 = pshuflw(auVar65,auVar93,0xe8);
      auVar94._4_4_ = auVar75._4_4_;
      auVar94._0_4_ = auVar75._4_4_;
      auVar94._8_4_ = auVar75._12_4_;
      auVar94._12_4_ = auVar75._12_4_;
      auVar59 = pshuflw(auVar75,auVar94,0xe8);
      auVar7._8_4_ = 0xffffffff;
      auVar7._0_8_ = 0xffffffffffffffff;
      auVar7._12_4_ = 0xffffffff;
      auVar78 = packssdw(auVar78 & auVar83,(auVar59 | auVar78 & auVar83) ^ auVar7);
      auVar78 = packsswb(auVar78,auVar78);
      if ((auVar78 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
        data[lVar42] = '\0';
      }
      auVar21._4_4_ = auVar75._0_4_;
      auVar21._0_4_ = auVar75._0_4_;
      auVar21._8_4_ = auVar75._8_4_;
      auVar21._12_4_ = auVar75._8_4_;
      auVar94 = auVar93 & auVar21 | auVar94;
      auVar59 = packssdw(auVar94,auVar94);
      auVar8._8_4_ = 0xffffffff;
      auVar8._0_8_ = 0xffffffffffffffff;
      auVar8._12_4_ = 0xffffffff;
      auVar78 = packssdw(auVar78,auVar59 ^ auVar8);
      auVar78 = packsswb(auVar78,auVar78);
      if ((auVar78._12_2_ >> 8 & 1) != 0) {
        data[local_a8] = '\0';
      }
      auVar78 = (auVar76 | _DAT_0073c3b0) ^ auVar23;
      auVar66._0_4_ = -(uint)(iVar29 < auVar78._0_4_);
      auVar66._4_4_ = -(uint)(iVar80 < auVar78._4_4_);
      auVar66._8_4_ = -(uint)(iVar81 < auVar78._8_4_);
      auVar66._12_4_ = -(uint)(iVar82 < auVar78._12_4_);
      auVar95._4_4_ = auVar66._0_4_;
      auVar95._0_4_ = auVar66._0_4_;
      auVar95._8_4_ = auVar66._8_4_;
      auVar95._12_4_ = auVar66._8_4_;
      auVar77._4_4_ = -(uint)(auVar78._4_4_ == iVar80);
      auVar77._12_4_ = -(uint)(auVar78._12_4_ == iVar82);
      auVar77._0_4_ = auVar77._4_4_;
      auVar77._8_4_ = auVar77._12_4_;
      auVar79._4_4_ = auVar66._4_4_;
      auVar79._0_4_ = auVar66._4_4_;
      auVar79._8_4_ = auVar66._12_4_;
      auVar79._12_4_ = auVar66._12_4_;
      auVar59 = auVar77 & auVar95 | auVar79;
      auVar78 = packssdw(auVar66,auVar59);
      auVar9._8_4_ = 0xffffffff;
      auVar9._0_8_ = 0xffffffffffffffff;
      auVar9._12_4_ = 0xffffffff;
      auVar78 = packssdw(auVar78 ^ auVar9,auVar78 ^ auVar9);
      auVar78 = packsswb(auVar78,auVar78);
      if ((auVar78 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
        data[lVar50] = '\0';
      }
      auVar78 = pshufhw(auVar78,auVar95,0x84);
      auVar59 = pshufhw(auVar59,auVar77,0x84);
      in_XMM2 = auVar59 & auVar78;
      auVar78 = pshufhw(auVar78,auVar79,0x84);
      auVar67._8_4_ = 0xffffffff;
      auVar67._0_8_ = 0xffffffffffffffff;
      auVar67._12_4_ = 0xffffffff;
      auVar67 = (auVar78 | in_XMM2) ^ auVar67;
      auVar78 = packssdw(auVar67,auVar67);
      in_XMM1 = packsswb(auVar78,auVar78);
      if ((in_XMM1._14_2_ >> 8 & 1) != 0) {
        data[local_98] = '\0';
      }
      uVar51 = uVar51 + 0x10;
      local_98 = local_98 + lVar47;
      local_a8 = local_a8 + lVar47;
      lVar42 = lVar42 + lVar47;
      lVar48 = lVar48 + lVar47;
      lVar35 = lVar35 + lVar47;
      lVar38 = lVar38 + lVar47;
      lVar55 = lVar55 + lVar47;
      lVar46 = lVar46 + lVar47;
      lVar54 = lVar54 + lVar47;
      local_a0 = local_a0 + lVar47;
      lVar34 = lVar34 + lVar47;
      lVar53 = lVar53 + lVar47;
      lVar49 = lVar49 + lVar47;
      lVar32 = lVar32 + lVar47;
      local_80 = local_80 + lVar47;
    } while ((len + 0xfU & 0xfffffff0) != uVar51);
    in_EAX = stereo;
    if (0 < len) {
      local_b8 = data;
      do {
        iVar29 = readblock(f,(readblock_crap *)local_58);
        if (iVar29 != 0) {
          return iVar29;
        }
        uVar33 = 0x8000;
        if ((uint)len < 0x8000) {
          uVar33 = len;
        }
        uVar30 = len - uVar33;
        cVar44 = '\0';
        uVar40 = 9;
        bVar57 = true;
        cVar56 = '\0';
        uVar52 = 0;
        uVar41 = len;
        do {
          while( true ) {
            bVar39 = (byte)uVar40;
            uVar43 = uVar40 & 0xff;
            uVar31 = readbits(uVar43,(readblock_crap *)local_58);
            if (6 < bVar39) break;
            if ((uVar31 & 0xffff) == 1 << (bVar39 - 1 & 0x1f)) {
              iVar29 = readbits(3,(readblock_crap *)local_58);
              uVar40 = iVar29 + (uint)(uVar43 <= (iVar29 + 1U & 0xffff)) + 1;
              goto LAB_0071e3fb;
            }
LAB_0071e40e:
            uVar37 = (int)(char)(uVar31 << (8 - bVar39 & 0x1f)) >> (8 - bVar39 & 0x1f);
            uVar43 = uVar40;
LAB_0071e421:
            uVar40 = uVar43;
            cVar56 = cVar56 + (char)uVar37;
            cVar44 = cVar44 + cVar56;
            cVar36 = cVar44;
            if (it215 == 0) {
              cVar36 = cVar56;
            }
            *local_b8 = cVar36;
            local_b8 = local_b8 + (ulong)(uint)stereo + 1;
            uVar41 = uVar41 - 1;
            uVar52 = uVar52 + 1;
            bVar57 = uVar52 < uVar33;
            len = uVar30;
            if (uVar52 == uVar33) goto LAB_0071e478;
          }
          if (8 < bVar39) {
            if (bVar39 != 9) {
              free((void *)local_58._0_8_);
              return extraout_EAX_00;
            }
            if ((uVar31 >> 8 & 1) != 0) {
              uVar40 = uVar31 + 1;
              goto LAB_0071e3fb;
            }
            uVar37 = uVar31;
            uVar43 = 9;
            goto LAB_0071e421;
          }
          uVar37 = uVar31 & 0xffff;
          uVar45 = (0xffU >> (9 - bVar39 & 0x1f)) + 0xfc & 0xff;
          if ((uVar37 <= uVar45) || (uVar45 + 8 < uVar37)) {
            uVar43 = 8;
            if (bVar39 == 7) goto LAB_0071e40e;
            goto LAB_0071e421;
          }
          uVar40 = (uint)(uVar43 <= (uVar31 - uVar45 & 0xffff)) + (uVar31 - uVar45);
LAB_0071e3fb:
          len = uVar41;
        } while (bVar57);
LAB_0071e478:
        free((void *)local_58._0_8_);
        auVar22._8_8_ = 0;
        auVar22._0_8_ = local_58._8_8_;
        local_58 = auVar22 << 0x40;
        in_EAX = extraout_EAX;
      } while (0 < len);
    }
  }
  return in_EAX;
}

Assistant:

static int decompress8(DUMBFILE *f, signed char *data, int len, int it215, int stereo)
{
	int blocklen, blockpos;
	byte bitwidth;
	word val;
	char d1, d2;
	readblock_crap crap;

	memset(&crap, 0, sizeof(crap));

	for (blocklen = 0, blockpos = 0; blocklen < len; blocklen++, blockpos += 1 + stereo)
		data[ blockpos ] = 0;

	while (len > 0) {
		//Read a block of compressed data:
		if (readblock(f, &crap))
			return -1;
		//Set up a few variables
		blocklen = (len < 0x8000) ? len : 0x8000; //Max block length is 0x8000 bytes
		blockpos = 0;
		bitwidth = 9;
		d1 = d2 = 0;
		//Start the decompression:
		while (blockpos < blocklen) {
			//Read a value:
			val = (word)readbits(bitwidth, &crap);
			//Check for bit width change:

			if (bitwidth < 7) { //Method 1:
				if (val == (1 << (bitwidth - 1))) {
					val = (word)readbits(3, &crap) + 1;
					bitwidth = (val < bitwidth) ? val : val + 1;
					continue;
				}
			}
			else if (bitwidth < 9) { //Method 2
				byte border = (0xFF >> (9 - bitwidth)) - 4;

				if (val > border && val <= (border + 8)) {
					val -= border;
					bitwidth = (val < bitwidth) ? val : val + 1;
					continue;
				}
			}
			else if (bitwidth == 9) { //Method 3
				if (val & 0x100) {
					bitwidth = (val + 1) & 0xFF;
					continue;
				}
			}
			else { //Illegal width, abort ?
				freeblock(&crap);
				return -1;
			}

			//Expand the value to signed byte:
			{
				char v; //The sample value:
				if (bitwidth < 8) {
					byte shift = 8 - bitwidth;
					v = (val << shift);
					v >>= shift;
				}
				else
					v = (char)val;

				//And integrate the sample value
				//(It always has to end with integration doesn't it ? ;-)
				d1 += v;
				d2 += d1;
			}

			//Store !
			/* Version 2.15 was an unofficial version with hacked compression
			 * code. Yay, better compression :D
			 */
			*data++ = it215 ? d2 : d1;
			data += stereo;
			len--;
			blockpos++;
		}
		freeblock(&crap);
	}
	return 0;
}